

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O3

Maybe<kj::StringTree> * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeBrandDepInitializer
          (Maybe<kj::StringTree> *__return_storage_ptr__,CapnpcCppMain *this,Method method,
          StructSchema type,StringPtr suffix)

{
  size_t sVar1;
  Maybe<kj::_::Mutex::Waiter_&> MVar2;
  Branch *pBVar3;
  Impl *pIVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Waiter *pWVar7;
  int iVar8;
  Maybe<kj::StringTree> *pMVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Schema SVar10;
  CppTypeName *name_00;
  char *pcVar11;
  CapnpcCppMain *this_00;
  char *ptrCopy;
  StringPtr SVar12;
  StringPtr name_01;
  StringPtr innerName;
  CppTypeName name;
  Reader typeProto;
  Schema local_180;
  String local_178;
  undefined1 local_158 [8];
  char *local_150;
  Maybe<kj::_::Mutex::Waiter_&> MStack_148;
  ArrayDisposer *local_140;
  Branch *pBStack_138;
  Impl *local_130;
  ArrayDisposer *pAStack_128;
  bool local_120;
  bool bStack_11f;
  bool bStack_11e;
  bool bStack_11d;
  Maybe<capnp::InterfaceSchema::Method> local_118;
  Reader local_c8;
  ProcessContext *local_98;
  char *local_90;
  Waiter *pWStack_88;
  ArrayDisposer *local_80;
  Branch *pBStack_78;
  Impl *local_70;
  ArrayDisposer *pAStack_68;
  bool local_60;
  bool bStack_5f;
  bool bStack_5e;
  bool bStack_5d;
  PointerReader local_58;
  ArrayPtr<const_char> local_38;
  
  local_180 = type.super_Schema.raw;
  Schema::getProto(&local_c8,&local_180);
  if ((local_c8._reader.dataSize < 0xc0) || (*(long *)((long)local_c8._reader.data + 0x10) == 0)) {
    local_118.ptr._0_8_ = local_118.ptr._0_8_ & 0xffffffffffffff00;
    this_00 = (CapnpcCppMain *)local_158;
    SVar10 = method.parent.super_Schema.raw;
    cppFullName((CppTypeName *)this_00,this,method.parent.super_Schema.raw,
                method.parent.super_Schema.raw,&local_118);
    SVar12 = protoName<capnp::schema::Method::Reader>(this_00,method.proto._reader);
    name_01.content.ptr = (char *)SVar12.content.size_;
    name_01.content.size_ = (size_t)SVar10.raw;
    toTitleCase((String *)&local_118,(CapnpcCppMain *)SVar12.content.ptr,name_01);
    uVar6 = local_118.ptr.field_1.value.parent.super_Schema.raw;
    uVar5 = local_118.ptr._0_8_;
    local_58.segment = (SegmentReader *)local_118.ptr._0_8_;
    if ((Schema)local_118.ptr.field_1.value.parent.super_Schema.raw == (Schema)0x0) {
      local_58.segment = (SegmentReader *)0x0;
    }
    local_58.capTable = (CapTableReader *)(ArrayPtr<const_char> *)0x0;
    if ((Schema)local_118.ptr.field_1.value.parent.super_Schema.raw != (Schema)0x0) {
      local_58.capTable =
           (CapTableReader *)((long)local_118.ptr.field_1.value.parent.super_Schema.raw + -1);
    }
    local_38.size_ = suffix.content.size_ - 1;
    local_38.ptr = suffix.content.ptr;
    kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              (&local_178,(_ *)&local_58,&local_38,(ArrayPtr<const_char> *)local_58.capTable);
    if ((_Hash_node_base *)uVar5 != (_Hash_node_base *)0x0) {
      local_118.ptr._0_8_ = (_Hash_node_base *)0x0;
      local_118.ptr.field_1.value.parent.super_Schema.raw = (InterfaceSchema)(Schema)0x0;
      (*(code *)**(undefined8 **)local_118.ptr.field_1._8_8_)
                (local_118.ptr.field_1._8_8_,uVar5,1,uVar6,uVar6,0);
    }
    local_58.pointer = local_c8._reader.pointers + 5;
    if (local_c8._reader.pointerCount < 6) {
      local_58.pointer = (WirePointer *)0x0;
    }
    if (local_c8._reader.pointerCount < 6) {
      local_c8._reader.segment._0_4_ = 0;
      local_c8._reader.segment._4_4_ = 0;
      local_c8._reader.capTable._0_4_ = 0;
      local_c8._reader.capTable._4_4_ = 0;
      local_c8._reader.nestingLimit = 0x7fffffff;
    }
    local_58.segment =
         (SegmentReader *)CONCAT44(local_c8._reader.segment._4_4_,local_c8._reader.segment._0_4_);
    local_58.capTable =
         (CapTableReader *)CONCAT44(local_c8._reader.capTable._4_4_,local_c8._reader.capTable._0_4_)
    ;
    name_00 = (CppTypeName *)0x0;
    local_58.nestingLimit = local_c8._reader.nestingLimit;
    _::PointerReader::getList((ListReader *)&local_118,&local_58,INLINE_COMPOSITE,(word *)0x0);
    pcVar11 = local_178.content.ptr;
    if (local_178.content.size_ == 0) {
      pcVar11 = "";
    }
    SVar12.content.size_ = local_178.content.size_ + (local_178.content.size_ == 0);
    if (local_118.ptr.field_1._16_4_ == 0) {
      innerName.content.size_ = SVar12.content.size_;
      innerName.content.ptr = pcVar11;
      CppTypeName::addMemberType((CppTypeName *)local_158,innerName);
    }
    else {
      name_00 = (CppTypeName *)&local_118;
      local_118.ptr._0_8_ = (_Hash_node_base *)0x0;
      local_118.ptr.field_1.value.parent.super_Schema.raw = (InterfaceSchema)(Schema)0x0;
      local_118.ptr.field_1._8_8_ = (undefined8 *)0x0;
      SVar12.content.ptr = pcVar11;
      CppTypeName::addMemberTemplate
                ((CppTypeName *)local_158,SVar12,
                 (Array<capnp::(anonymous_namespace)::CppTypeName> *)name_00);
    }
    local_98 = (ProcessContext *)local_158;
    local_90 = local_150;
    pWStack_88 = MStack_148.ptr;
    local_150 = (char *)0x0;
    MStack_148.ptr = (Waiter *)0x0;
    local_80 = local_140;
    pBStack_78 = pBStack_138;
    local_70 = local_130;
    pAStack_68 = pAStack_128;
    pBStack_138 = (Branch *)0x0;
    local_130 = (Impl *)0x0;
    local_60 = local_120;
    bStack_5f = bStack_11f;
    bStack_5e = bStack_11e;
    bStack_5d = bStack_11d;
    pMVar9 = makeBrandDepInitializer
                       (__return_storage_ptr__,(CapnpcCppMain *)local_180.raw,
                        (RawBrandedSchema *)&local_98,name_00);
    pIVar4 = local_70;
    pBVar3 = pBStack_78;
    if (pBStack_78 != (Branch *)0x0) {
      pBStack_78 = (Branch *)0x0;
      local_70 = (Impl *)0x0;
      pMVar9 = (Maybe<kj::StringTree> *)
               (*(code *)((__node_base_ptr)pAStack_68->_vptr_ArrayDisposer)->_M_nxt)
                         (pAStack_68,pBVar3,0x40,pIVar4,pIVar4,
                          kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    pWVar7 = pWStack_88;
    pcVar11 = local_90;
    if (local_90 != (char *)0x0) {
      local_90 = (char *)0x0;
      pWStack_88 = (Waiter *)0x0;
      iVar8 = (*(code *)(((Waiter *)local_80->_vptr_ArrayDisposer)->next).ptr)
                        (local_80,pcVar11,1,pWVar7,pWVar7,0);
      pMVar9 = (Maybe<kj::StringTree> *)CONCAT44(extraout_var,iVar8);
    }
    sVar1 = local_178.content.size_;
    pcVar11 = local_178.content.ptr;
    if (local_178.content.ptr != (char *)0x0) {
      local_178.content.ptr = (char *)0x0;
      local_178.content.size_ = 0;
      iVar8 = (**(local_178.content.disposer)->_vptr_ArrayDisposer)
                        (local_178.content.disposer,pcVar11,1,sVar1,sVar1,0);
      pMVar9 = (Maybe<kj::StringTree> *)CONCAT44(extraout_var_00,iVar8);
    }
    pIVar4 = local_130;
    pBVar3 = pBStack_138;
    if (pBStack_138 != (Branch *)0x0) {
      pBStack_138 = (Branch *)0x0;
      local_130 = (Impl *)0x0;
      pMVar9 = (Maybe<kj::StringTree> *)
               (*(code *)((__node_base_ptr)pAStack_128->_vptr_ArrayDisposer)->_M_nxt)
                         (pAStack_128,pBVar3,0x40,pIVar4,pIVar4,
                          kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    MVar2.ptr = MStack_148.ptr;
    pcVar11 = local_150;
    if (local_150 != (char *)0x0) {
      local_150 = (char *)0x0;
      MStack_148.ptr = (Waiter *)0x0;
      iVar8 = (*(code *)(((Waiter *)local_140->_vptr_ArrayDisposer)->next).ptr)
                        (local_140,pcVar11,1,MVar2.ptr,MVar2.ptr,0);
      pMVar9 = (Maybe<kj::StringTree> *)CONCAT44(extraout_var_01,iVar8);
    }
  }
  else {
    pMVar9 = makeBrandDepInitializer(__return_storage_ptr__,this,local_180);
  }
  return pMVar9;
}

Assistant:

kj::Maybe<kj::StringTree> makeBrandDepInitializer(
      InterfaceSchema::Method method, StructSchema type, kj::StringPtr suffix) {
    auto typeProto = type.getProto();
    if (typeProto.getScopeId() == 0) {
      // This is an auto-generated params or results type.
      auto name = cppFullName(method.getContainingInterface(), nullptr);
      auto memberTypeName = kj::str(toTitleCase(protoName(method.getProto())), suffix);

      if (typeProto.getParameters().size() == 0) {
        name.addMemberType(memberTypeName);
      } else {
        // The method has implicit parameters (i.e. it's generic). For the purpose of the brand
        // dep initializer, we only want to supply the default AnyPointer variant, so just don't
        // pass any parameters here.
        name.addMemberTemplate(memberTypeName, nullptr);
      }
      return makeBrandDepInitializer(type, kj::mv(name));
    } else {
      return makeBrandDepInitializer(type);
    }
  }